

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Float pbrt::SampleCatmullRom2D
                (span<const_float> nodes1,span<const_float> nodes2,span<const_float> values,
                span<const_float> cdf,Float alpha,Float u,Float *fval,Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  int iVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Float FVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [64];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 in_ZMM17 [64];
  span<float> weights;
  float local_48 [4];
  float local_38;
  int local_34;
  float fVar21;
  
  auVar25 = in_ZMM17._0_16_;
  pfVar16 = values.ptr;
  uVar12 = nodes2.n;
  pfVar13 = nodes2.ptr;
  weights.n = 4;
  weights.ptr = local_48;
  local_38 = u;
  bVar11 = CatmullRomWeights(nodes1,alpha,&local_34,weights);
  FVar29 = 0.0;
  if (bVar11) {
    auVar30 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar17 = 0;
    do {
      fVar36 = local_48[lVar17];
      if ((fVar36 != 0.0) || (NAN(fVar36))) {
        auVar23 = vfmadd231ss_fma(auVar30._0_16_,ZEXT416((uint)fVar36),
                                  ZEXT416(*(uint *)((long)cdf.ptr +
                                                   (long)(local_34 + (int)lVar17) * uVar12 * 4 +
                                                   ((long)((uVar12 << 0x20) + -0x100000000) >> 0x1e)
                                                   )));
        auVar30 = ZEXT1664(auVar23);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    fVar36 = auVar30._0_4_ * local_38;
    uVar14 = uVar12 - 2;
    if ((long)uVar14 < 1) {
      uVar18 = 0;
    }
    else {
      lVar17 = 1;
      uVar18 = uVar14;
      do {
        uVar19 = uVar18 >> 1;
        auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar20 = 0;
        do {
          fVar1 = local_48[lVar20];
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            auVar23 = vfmadd231ss_fma(auVar32._0_16_,ZEXT416((uint)fVar1),
                                      ZEXT416((uint)cdf.ptr[(long)(int)(uVar19 + lVar17) +
                                                            (long)(local_34 + (int)lVar20) * uVar12]
                                             ));
            auVar32 = ZEXT1664(auVar23);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 4);
        uVar18 = uVar18 + ~uVar19;
        lVar20 = uVar19 + lVar17 + 1;
        if (fVar36 < auVar32._0_4_) {
          uVar18 = uVar19;
          lVar20 = lVar17;
        }
        lVar17 = lVar20;
      } while (0 < (long)uVar18);
      if (lVar17 - 1U < uVar14) {
        uVar14 = lVar17 - 1U;
      }
      uVar18 = 0;
      if (0 < lVar17) {
        uVar18 = uVar14;
      }
    }
    iVar15 = (int)uVar18;
    lVar17 = uVar18 << 0x20;
    auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar20 = 0;
    do {
      fVar1 = local_48[lVar20];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        auVar23 = vfmadd231ss_fma(auVar32._0_16_,ZEXT416((uint)fVar1),
                                  ZEXT416((uint)pfVar16[(long)iVar15 +
                                                        (long)(local_34 + (int)lVar20) * uVar12]));
        auVar32 = ZEXT1664(auVar23);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    auVar34 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar20 = 0;
    do {
      fVar1 = local_48[lVar20];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        auVar23 = vfmadd231ss_fma(auVar34._0_16_,ZEXT416((uint)fVar1),
                                  ZEXT416(*(uint *)((long)pfVar16 +
                                                   (long)(local_34 + (int)lVar20) * uVar12 * 4 +
                                                   (lVar17 + 0x100000000 >> 0x1e))));
        auVar34 = ZEXT1664(auVar23);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar20 = 0;
    fVar1 = *(float *)((long)pfVar13 + (lVar17 >> 0x1e));
    do {
      fVar2 = local_48[lVar20];
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        auVar23 = vfmadd231ss_fma(auVar37._0_16_,ZEXT416((uint)fVar2),
                                  ZEXT416((uint)cdf.ptr[(long)iVar15 +
                                                        (long)(local_34 + (int)lVar20) * uVar12]));
        auVar37 = ZEXT1664(auVar23);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    fVar2 = pfVar13[lVar17 + 0x100000000 >> 0x20] - fVar1;
    fVar33 = auVar34._0_4_;
    fVar40 = auVar32._0_4_;
    if (iVar15 < 1) {
      fVar35 = fVar33 - fVar40;
    }
    else {
      auVar39 = ZEXT864(0);
      lVar20 = 0;
      do {
        fVar35 = local_48[lVar20];
        if ((fVar35 != 0.0) || (NAN(fVar35))) {
          auVar23 = vfmadd231ss_fma(auVar39._0_16_,ZEXT416((uint)fVar35),
                                    ZEXT416((uint)pfVar16[(ulong)(iVar15 - 1) +
                                                          (long)(local_34 + (int)lVar20) * uVar12]))
          ;
          auVar39 = ZEXT1664(auVar23);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      fVar35 = (fVar2 * (fVar33 - auVar39._0_4_)) /
               (pfVar13[lVar17 + 0x100000000 >> 0x20] - pfVar13[iVar15 - 1]);
    }
    fVar36 = (fVar36 - auVar37._0_4_) / fVar2;
    uVar14 = lVar17 + 0x200000000 >> 0x20;
    if (uVar14 < uVar12) {
      auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
      lVar17 = 0;
      do {
        fVar38 = local_48[lVar17];
        if ((fVar38 != 0.0) || (NAN(fVar38))) {
          auVar23 = vfmadd231ss_fma(auVar37._0_16_,ZEXT416((uint)fVar38),
                                    ZEXT416((uint)pfVar16[uVar14 + (long)(local_34 + (int)lVar17) *
                                                                   uVar12]));
          auVar37 = ZEXT1664(auVar23);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      fVar38 = (fVar2 * (auVar37._0_4_ - fVar40)) / (pfVar13[uVar14] - fVar1);
    }
    else {
      fVar38 = fVar33 - fVar40;
    }
    auVar27 = vfmsub231ss_fma(ZEXT416((uint)fVar38),ZEXT416((uint)fVar35),ZEXT416(0xc0000000));
    auVar26 = ZEXT816(0);
    auVar23 = vfmadd231ss_fma(auVar34._0_16_,auVar27,ZEXT416(0x3eaaaaab));
    auVar8 = vfmadd231ss_fma(auVar27,ZEXT416((uint)(fVar33 - fVar40)),ZEXT416(0x40400000));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)((fVar40 - fVar33) * 0.5)),
                             ZEXT416((uint)(fVar38 + fVar35)),ZEXT416(0x3e800000));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 + fVar35)),ZEXT416((uint)(fVar40 - fVar33)),
                              ZEXT416(0x40000000));
    fVar33 = fVar35 * 0.5;
    fVar38 = auVar23._0_4_ - fVar40;
    auVar23 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar9,ZEXT416((uint)fVar38));
    auVar23 = vfmadd213ss_fma(auVar23,auVar26,ZEXT416((uint)fVar33));
    auVar27 = ZEXT416((uint)(auVar10._0_4_ + auVar8._0_4_ + fVar35 + fVar40));
    auVar31 = auVar32._0_16_;
    auVar23 = vfmadd213ss_fma(auVar23,auVar26,auVar31);
    auVar23 = vfmadd213ss_fma(auVar23,auVar26,auVar26);
    auVar22 = vsubss_avx512f(auVar23,ZEXT416((uint)fVar36));
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx512vl(auVar22,auVar23);
    if (1e-06 <= auVar23._0_4_) {
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar24 = ZEXT416((uint)((fVar33 + auVar9._0_4_ + fVar38 + fVar40 + 0.0) - fVar36));
      auVar23 = vandps_avx512vl(auVar24,auVar26);
      fVar40 = auVar23._0_4_;
      if (1e-06 <= fVar40) {
        auVar23 = vsubss_avx512f(auVar24,auVar22);
        auVar41 = ZEXT816(0) << 0x20;
        auVar32 = ZEXT464(0x3f800000);
        auVar24 = vxorps_avx512vl(auVar25,auVar25);
        uVar4 = vcmpps_avx512vl(auVar22,auVar41,1);
        auVar25 = vdivss_avx512f(auVar22,auVar23);
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        fVar21 = 0.0 - auVar25._0_4_;
        while( true ) {
          auVar25 = vaddss_avx512f(auVar32._0_16_,auVar24);
          uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar21),auVar32._0_16_,1);
          bVar11 = (bool)((byte)uVar5 & 1);
          fVar3 = auVar25._0_4_ * 0.5;
          uVar5 = vcmpss_avx512f(auVar24,ZEXT416((uint)fVar21),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          fVar21 = (float)((uint)bVar6 * ((uint)bVar11 * (int)fVar21 + (uint)!bVar11 * (int)fVar3) +
                          (uint)!bVar6 * (int)fVar3);
          auVar26 = ZEXT416((uint)fVar21);
          auVar27 = vfmadd213ss_avx512f(auVar9,auVar26,ZEXT416((uint)fVar38));
          auVar25 = vfmadd213ss_fma(auVar10,auVar26,auVar8);
          auVar27 = vfmadd213ss_avx512f(auVar27,auVar26,ZEXT416((uint)fVar33));
          auVar25 = vfmadd213ss_fma(auVar25,auVar26,ZEXT416((uint)fVar35));
          auVar22 = vfmadd213ss_avx512f(auVar27,auVar26,auVar31);
          auVar27 = vfmadd213ss_fma(auVar25,auVar26,auVar31);
          auVar25 = vfmadd213ss_avx512f(auVar22,auVar26,auVar41);
          auVar25 = vsubss_avx512f(auVar25,ZEXT416((uint)fVar36));
          auVar22 = vandps_avx512vl(auVar25,auVar23);
          vucomiss_avx512f(auVar22);
          if (fVar40 < 1e-06) break;
          uVar5 = vcmpps_avx512vl(auVar25,auVar41,5);
          bVar7 = (byte)uVar4 ^ (byte)uVar5;
          auVar22 = ZEXT416((uint)(bVar7 & 1) * auVar32._0_4_ +
                            (uint)!(bool)(bVar7 & 1) * (int)fVar21);
          auVar24._0_4_ = (uint)(bVar7 & 1) * (int)fVar21 + (uint)!(bool)(bVar7 & 1) * auVar24._0_4_
          ;
          auVar28 = vsubss_avx512f(auVar22,auVar24);
          vucomiss_avx512f(auVar28);
          if (fVar40 < 1e-06) break;
          auVar25 = vdivss_avx512f(auVar25,auVar27);
          auVar32 = ZEXT1664(auVar22);
          fVar21 = fVar21 - auVar25._0_4_;
        }
      }
      else {
        auVar26 = SUB6416(ZEXT464(0x3f800000),0);
      }
    }
    if (fval != (Float *)0x0) {
      *fval = auVar27._0_4_;
    }
    if (pdf != (Float *)0x0) {
      *pdf = auVar27._0_4_ / auVar30._0_4_;
    }
    auVar25 = vfmadd213ss_fma(auVar26,ZEXT416((uint)fVar2),ZEXT416((uint)fVar1));
    FVar29 = auVar25._0_4_;
  }
  return FVar29;
}

Assistant:

Float SampleCatmullRom2D(pstd::span<const Float> nodes1, pstd::span<const Float> nodes2,
                         pstd::span<const Float> values, pstd::span<const Float> cdf,
                         Float alpha, Float u, Float *fval, Float *pdf) {
    // Determine offset and coefficients for the _alpha_ parameter
    int offset;
    Float weights[4];
    if (!CatmullRomWeights(nodes1, alpha, &offset, weights))
        return 0;

    // Define a lambda function to interpolate table entries
    auto interpolate = [&](pstd::span<const Float> array, int idx) {
        Float value = 0;
        for (int i = 0; i < 4; ++i)
            if (weights[i] != 0)
                value += array[(offset + i) * nodes2.size() + idx] * weights[i];
        return value;
    };

    // Map _u_ to a spline interval by inverting the interpolated _cdf_
    Float maximum = interpolate(cdf, nodes2.size() - 1);
    u *= maximum;
    int idx =
        FindInterval(nodes2.size(), [&](int i) { return interpolate(cdf, i) <= u; });

    // Look up node positions and interpolated function values
    Float f0 = interpolate(values, idx), f1 = interpolate(values, idx + 1);
    Float x0 = nodes2[idx], x1 = nodes2[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;

    // Re-scale _u_ using the interpolated _cdf_
    u = (u - interpolate(cdf, idx)) / width;

    // Approximate derivatives using finite differences of the interpolant
    if (idx > 0)
        d0 = width * (f1 - interpolate(values, idx - 1)) / (x1 - nodes2[idx - 1]);
    else
        d0 = f1 - f0;
    if (idx + 2 < nodes2.size())
        d1 = width * (interpolate(values, idx + 2) - f0) / (nodes2[idx + 2] - x0);
    else
        d1 = f1 - f0;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / maximum;
    return x0 + width * t;
}